

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_switched(Curl_easy *data,char *mem,size_t nread)

{
  connectdata *conn_00;
  HTTP *pHVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  anon_union_248_5_a113b5f6_for_proto *httpc_00;
  char *pcVar5;
  HTTP *stream;
  int rv;
  http_conn *httpc;
  connectdata *conn;
  size_t sStack_28;
  CURLcode result;
  size_t nread_local;
  char *mem_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  httpc_00 = &conn_00->proto;
  pHVar1 = (data->req).p.http;
  sStack_28 = nread;
  nread_local = (size_t)mem;
  mem_local = (char *)data;
  conn._4_4_ = Curl_http2_setup(data,conn_00);
  data_local._4_4_ = conn._4_4_;
  if (conn._4_4_ == CURLE_OK) {
    (conn_00->proto).ftpc.pp.sendbuf.toobig = (size_t)conn_00->recv[0];
    (conn_00->proto).ftpc.pp.sendbuf.allc = (size_t)conn_00->send[0];
    conn_00->recv[0] = http2_recv;
    conn_00->send[0] = http2_send;
    if (*(int *)(mem_local + 0x15c) == 3) {
      pHVar1->stream_id = 1;
      uVar3 = nghttp2_session_upgrade2
                        ((conn_00->proto).httpc.h2,(uint8_t *)httpc_00,(conn_00->proto).httpc.binlen
                         ,(uint)(mem_local[0x11e0] == '\x05'),(void *)0x0);
      pcVar2 = mem_local;
      if (uVar3 != 0) {
        pcVar5 = nghttp2_strerror(uVar3);
        Curl_failf((Curl_easy *)pcVar2,"nghttp2_session_upgrade2() failed: %s(%d)",pcVar5,
                   (ulong)uVar3);
        return CURLE_HTTP2;
      }
      iVar4 = nghttp2_session_set_stream_user_data
                        ((conn_00->proto).httpc.h2,pHVar1->stream_id,mem_local);
      if (iVar4 != 0) {
        Curl_infof((Curl_easy *)mem_local,"http/2: failed to set user_data for stream %u",
                   (ulong)(uint)pHVar1->stream_id);
      }
    }
    else {
      populate_settings((Curl_easy *)mem_local,&httpc_00->httpc);
      pHVar1->stream_id = -1;
      uVar3 = nghttp2_submit_settings
                        ((conn_00->proto).httpc.h2,'\0',(conn_00->proto).httpc.local_settings,
                         (conn_00->proto).httpc.local_settings_num);
      pcVar2 = mem_local;
      if (uVar3 != 0) {
        pcVar5 = nghttp2_strerror(uVar3);
        Curl_failf((Curl_easy *)pcVar2,"nghttp2_submit_settings() failed: %s(%d)",pcVar5,
                   (ulong)uVar3);
        return CURLE_HTTP2;
      }
    }
    uVar3 = nghttp2_session_set_local_window_size((conn_00->proto).httpc.h2,'\0',0,0x2000000);
    pcVar2 = mem_local;
    if (uVar3 == 0) {
      if (sStack_28 < 0x8001) {
        Curl_infof((Curl_easy *)mem_local,
                   "Copying HTTP/2 data in stream buffer to connection buffer after upgrade: len=%zu"
                   ,sStack_28);
        if (sStack_28 != 0) {
          memcpy((conn_00->proto).ftpc.pp.statemachine,(void *)nread_local,sStack_28);
        }
        (conn_00->proto).httpc.inbuflen = sStack_28;
        iVar4 = h2_process_pending_input
                          ((Curl_easy *)mem_local,&httpc_00->httpc,(CURLcode *)((long)&conn + 4));
        if (iVar4 == -1) {
          data_local._4_4_ = CURLE_HTTP2;
        }
        else {
          data_local._4_4_ = CURLE_OK;
        }
      }
      else {
        Curl_failf((Curl_easy *)mem_local,
                   "connection buffer size is too small to store data following HTTP Upgrade response header: buflen=%d, datalen=%zu"
                   ,0x8000,sStack_28);
        data_local._4_4_ = CURLE_HTTP2;
      }
    }
    else {
      pcVar5 = nghttp2_strerror(uVar3);
      Curl_failf((Curl_easy *)pcVar2,"nghttp2_session_set_local_window_size() failed: %s(%d)",pcVar5
                 ,(ulong)uVar3);
      data_local._4_4_ = CURLE_HTTP2;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http2_switched(struct Curl_easy *data,
                             const char *mem, size_t nread)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  struct http_conn *httpc = &conn->proto.httpc;
  int rv;
  struct HTTP *stream = data->req.p.http;

  result = Curl_http2_setup(data, conn);
  if(result)
    return result;

  httpc->recv_underlying = conn->recv[FIRSTSOCKET];
  httpc->send_underlying = conn->send[FIRSTSOCKET];
  conn->recv[FIRSTSOCKET] = http2_recv;
  conn->send[FIRSTSOCKET] = http2_send;

  if(data->req.upgr101 == UPGR101_RECEIVED) {
    /* stream 1 is opened implicitly on upgrade */
    stream->stream_id = 1;
    /* queue SETTINGS frame (again) */
    rv = nghttp2_session_upgrade2(httpc->h2, httpc->binsettings, httpc->binlen,
                                  data->state.httpreq == HTTPREQ_HEAD, NULL);
    if(rv) {
      failf(data, "nghttp2_session_upgrade2() failed: %s(%d)",
            nghttp2_strerror(rv), rv);
      return CURLE_HTTP2;
    }

    rv = nghttp2_session_set_stream_user_data(httpc->h2,
                                              stream->stream_id,
                                              data);
    if(rv) {
      infof(data, "http/2: failed to set user_data for stream %u",
            stream->stream_id);
      DEBUGASSERT(0);
    }
  }
  else {
    populate_settings(data, httpc);

    /* stream ID is unknown at this point */
    stream->stream_id = -1;
    rv = nghttp2_submit_settings(httpc->h2, NGHTTP2_FLAG_NONE,
                                 httpc->local_settings,
                                 httpc->local_settings_num);
    if(rv) {
      failf(data, "nghttp2_submit_settings() failed: %s(%d)",
            nghttp2_strerror(rv), rv);
      return CURLE_HTTP2;
    }
  }

  rv = nghttp2_session_set_local_window_size(httpc->h2, NGHTTP2_FLAG_NONE, 0,
                                             HTTP2_HUGE_WINDOW_SIZE);
  if(rv) {
    failf(data, "nghttp2_session_set_local_window_size() failed: %s(%d)",
          nghttp2_strerror(rv), rv);
    return CURLE_HTTP2;
  }

  /* we are going to copy mem to httpc->inbuf.  This is required since
     mem is part of buffer pointed by stream->mem, and callbacks
     called by nghttp2_session_mem_recv() will write stream specific
     data into stream->mem, overwriting data already there. */
  if(H2_BUFSIZE < nread) {
    failf(data, "connection buffer size is too small to store data following "
          "HTTP Upgrade response header: buflen=%d, datalen=%zu",
          H2_BUFSIZE, nread);
    return CURLE_HTTP2;
  }

  infof(data, "Copying HTTP/2 data in stream buffer to connection buffer"
        " after upgrade: len=%zu",
        nread);

  if(nread)
    memcpy(httpc->inbuf, mem, nread);

  httpc->inbuflen = nread;

  DEBUGASSERT(httpc->nread_inbuf == 0);

  if(-1 == h2_process_pending_input(data, httpc, &result))
    return CURLE_HTTP2;

  return CURLE_OK;
}